

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  treeNode *tree;
  string path;
  ifstream file;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Please input the script path:");
  std::endl<char,std::char_traits<char>>(poVar1);
  path._M_dataplus._M_p = (pointer)&path.field_2;
  path._M_string_length = 0;
  path.field_2._M_local_buf[0] = '\0';
  std::operator>>((istream *)&std::cin,(string *)&path);
  std::ifstream::ifstream(&file,(string *)&path,_S_in);
  tree = parse((istream *)&file);
  Executor::execute(tree);
  std::ifstream::close();
  std::ifstream::~ifstream(&file);
  std::__cxx11::string::~string((string *)&path);
  return 0;
}

Assistant:

int main()
{
    cout<<"Please input the script path:"<<endl;
    string path;
    cin>>path;
    ifstream file(path);
    treeNode* tree=parse(file);
    Executor::execute(tree);
    file.close();
}